

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Performance::uniformNiv(Functions *gl,int n,int location,int count,int *data)

{
  undefined4 in_register_0000000c;
  
  if (n - 1U < 4) {
    (*(&gl->uniform1iv)[(ulong)(n - 1U) * 8])
              (location,1,(GLint *)CONCAT44(in_register_0000000c,count));
    return;
  }
  return;
}

Assistant:

static void uniformNiv (const glw::Functions& gl, int n, int location, int count, const int* data)
{
	switch (n)
	{
		case 1: gl.uniform1iv(location, count, data); break;
		case 2: gl.uniform2iv(location, count, data); break;
		case 3: gl.uniform3iv(location, count, data); break;
		case 4: gl.uniform4iv(location, count, data); break;
		default: DE_ASSERT(false);
	}
}